

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_createv(ucvector *out,uint length,char *type,uchar *data)

{
  void *in_RCX;
  ucvector *in_RDX;
  uint in_ESI;
  uint error;
  uchar *chunk;
  uchar *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  local_4 = lodepng_chunk_init((uchar **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                               (uint)((ulong)in_RCX >> 0x20),(char *)in_stack_ffffffffffffffd0);
  if (local_4 == 0) {
    lodepng_memcpy(in_stack_ffffffffffffffd0 + 8,in_RCX,(ulong)in_ESI);
    lodepng_chunk_generate_crc(in_stack_ffffffffffffffd0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static unsigned lodepng_chunk_createv(ucvector* out,
  unsigned length, const char* type, const unsigned char* data) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, length, type));

  /*3: the data*/
  lodepng_memcpy(chunk + 8, data, length);

  /*4: CRC (of the chunkname characters and the data)*/
  lodepng_chunk_generate_crc(chunk);

  return 0;
}